

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O1

int llmsset_mark(llmsset_t dbs,uint64_t index)

{
  ulong *puVar1;
  uint64_t *puVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  int in_R9D;
  bool bVar7;
  
  puVar2 = dbs->bitmap2;
  uVar6 = 0x8000000000000000 >> (index & 0x3f);
  do {
    uVar3 = puVar2[index >> 6];
    bVar4 = false;
    iVar5 = 0;
    if ((uVar3 & uVar6) == 0) {
      puVar1 = puVar2 + (index >> 6);
      LOCK();
      bVar7 = uVar3 == *puVar1;
      if (bVar7) {
        *puVar1 = uVar3 | uVar6;
      }
      UNLOCK();
      bVar4 = !bVar7;
      iVar5 = in_R9D;
      if (bVar7) {
        iVar5 = 1;
      }
    }
    in_R9D = iVar5;
  } while (bVar4);
  return in_R9D;
}

Assistant:

int
llmsset_mark(const llmsset_t dbs, uint64_t index)
{
    _Atomic(uint64_t)* ptr = dbs->bitmap2 + (index/64);
    uint64_t mask = 0x8000000000000000LL >> (index&63);
    for (;;) {
        uint64_t v = *ptr;
        if (v & mask) return 0;
        if (atomic_compare_exchange_weak(ptr, &v, v|mask)) return 1;
    }
}